

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O1

void __thiscall
BlindFactor_Constractor_hex_Test::~BlindFactor_Constractor_hex_Test
          (BlindFactor_Constractor_hex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BlindFactor, Constractor_hex) {
  BlindFactor blind_factor(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_STREQ(
      blind_factor.GetHex().c_str(),
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_STREQ(
      blind_factor.GetData().GetHex().c_str(),
      "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  EXPECT_FALSE(blind_factor.IsEmpty());
}